

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> __thiscall
fmt::v8::detail::write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,
          basic_string_view<wchar_t> s,basic_format_specs<wchar_t> *specs,locale_ref param_4)

{
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar1;
  basic_string_view<wchar_t> s_00;
  error_handler local_39;
  size_t local_38;
  basic_format_specs<wchar_t> *specs_local;
  locale_ref param_3_local;
  basic_string_view<wchar_t> s_local;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out_local;
  
  local_38 = s.size_;
  s_00.data_ = s.data_;
  specs_local = specs;
  param_3_local.locale_ = out.container;
  check_string_type_spec<fmt::v8::detail::error_handler>
            (*(presentation_type *)(local_38 + 8),&local_39);
  s_00.size_ = local_38;
  bVar1 = write<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                    (this,(back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)
                          param_3_local.locale_,s_00,specs);
  return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar1.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out,
                         basic_string_view<type_identity_t<Char>> s,
                         const basic_format_specs<Char>& specs, locale_ref)
    -> OutputIt {
  check_string_type_spec(specs.type);
  return write(out, s, specs);
}